

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  U32 hBits_00;
  U32 mls_00;
  U32 *pUVar1;
  BYTE *pBVar2;
  U32 UVar3;
  size_t sVar4;
  size_t hash;
  U32 p;
  size_t hash0;
  U32 current;
  U32 fastHashFillStep;
  BYTE *iend;
  BYTE *ip;
  BYTE *base;
  U32 mls;
  U32 hBits;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  void *end_local;
  ZSTD_matchState_t *ms_local;
  
  pUVar1 = ms->hashTable;
  hBits_00 = (ms->cParams).hashLog;
  mls_00 = (ms->cParams).minMatch;
  pBVar2 = (ms->window).base;
  for (iend = pBVar2 + ms->nextToUpdate; iend + 3 < (BYTE *)((long)end - 6U); iend = iend + 3) {
    UVar3 = (int)iend - (int)pBVar2;
    sVar4 = ZSTD_hashPtr(iend,hBits_00,mls_00);
    pUVar1[sVar4] = UVar3;
    if (dtlm != ZSTD_dtlm_fast) {
      for (hash._4_4_ = 1; hash._4_4_ < 3; hash._4_4_ = hash._4_4_ + 1) {
        sVar4 = ZSTD_hashPtr(iend + hash._4_4_,hBits_00,mls_00);
        if (pUVar1[sVar4] == 0) {
          pUVar1[sVar4] = UVar3 + hash._4_4_;
        }
      }
    }
  }
  return;
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hBits = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash table.
     * Insert the other positions if their hash entry is empty.
     */
    for ( ; ip + fastHashFillStep < iend + 2; ip += fastHashFillStep) {
        U32 const current = (U32)(ip - base);
        size_t const hash0 = ZSTD_hashPtr(ip, hBits, mls);
        hashTable[hash0] = current;
        if (dtlm == ZSTD_dtlm_fast) continue;
        /* Only load extra positions for ZSTD_dtlm_full */
        {   U32 p;
            for (p = 1; p < fastHashFillStep; ++p) {
                size_t const hash = ZSTD_hashPtr(ip + p, hBits, mls);
                if (hashTable[hash] == 0) {  /* not yet filled */
                    hashTable[hash] = current + p;
    }   }   }   }
}